

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapFilterable *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  uint local_1c;
  uint i;
  Functions *gl;
  TextureCubeMapArrayGenerateMipMapFilterable *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x78))(0x8ca8,0);
  (**(code **)(lVar4 + 0xb8))(0x9009,0);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  local_1c = 0;
  while( true ) {
    sVar5 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::size
                      (&this->m_storage_configs);
    if (sVar5 <= local_1c) break;
    pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                       (&this->m_storage_configs,(ulong)local_1c);
    if (pvVar6->m_to_id != 0) {
      pcVar1 = *(code **)(lVar4 + 0x480);
      pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                         (&this->m_storage_configs,(ulong)local_1c);
      (*pcVar1)(1,&pvVar6->m_to_id);
      pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                         (&this->m_storage_configs,(ulong)local_1c);
      pvVar6->m_to_id = 0;
    }
    local_1c = local_1c + 1;
  }
  if (this->m_reference_data_ptr != (uchar *)0x0) {
    if (this->m_reference_data_ptr != (uchar *)0x0) {
      operator_delete__(this->m_reference_data_ptr);
    }
    this->m_reference_data_ptr = (uchar *)0x0;
  }
  if (this->m_rendered_data_ptr != (uchar *)0x0) {
    if (this->m_rendered_data_ptr != (uchar *)0x0) {
      operator_delete__(this->m_rendered_data_ptr);
    }
    this->m_rendered_data_ptr = (uchar *)0x0;
  }
  (**(code **)(lVar4 + 0xff0))(0xd05,4);
  (**(code **)(lVar4 + 0xff0))(0xcf5,4);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset texture and FBO bindings */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Release any ES objects that may have been created. */
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	for (unsigned int i = 0; i < m_storage_configs.size(); ++i)
	{
		if (m_storage_configs[i].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_storage_configs[i].m_to_id);

			m_storage_configs[i].m_to_id = 0;
		}
	}

	/* Release buffers the test may have allocated */
	if (m_reference_data_ptr != DE_NULL)
	{
		delete[] m_reference_data_ptr;

		m_reference_data_ptr = DE_NULL;
	}

	if (m_rendered_data_ptr != DE_NULL)
	{
		delete[] m_rendered_data_ptr;

		m_rendered_data_ptr = DE_NULL;
	}

	/* Restore pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Call base class' deinitialization routine. */
	TestCaseBase::deinit();
}